

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O0

void __thiscall
mp::SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>::
SolutionWriterImpl(SolutionWriterImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::SolFileWriter>
                   *this,StringRef stub,MultiObjTestSolver<2> *s,MultiObjMockProblemBuilder *b,
                  ArrayRef<long> *options)

{
  size_t in_RCX;
  BasicStringRef<char> *in_RDI;
  _func_int **in_R8;
  ArrayRef<long> *in_R9;
  ArrayRef<long> *in_stack_ffffffffffffffc8;
  BasicStringRef<char> *this_00;
  
  this_00 = in_RDI;
  SolutionHandler::SolutionHandler((SolutionHandler *)in_RDI);
  in_RDI->data_ = (char *)&PTR__SolutionWriterImpl_003a38c8;
  fmt::BasicStringRef<char>::to_string_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&in_RDI[2].size_);
  in_RDI[4].size_ = in_RCX;
  in_RDI[5].data_ = (char *)in_R8;
  ArrayRef<long>::ArrayRef(in_R9,in_stack_ffffffffffffffc8);
  *(undefined4 *)&in_RDI[8].data_ = 0;
  return;
}

Assistant:

SolutionWriterImpl(fmt::StringRef stub, Solver &s, ProblemBuilder &b,
                 ArrayRef<long> options = mp::ArrayRef<long>(0, 0))
    : stub_(stub.to_string()), overrideStub_(), solver_(s), builder_(b),
      options_(options), num_solutions_(0) {}